

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall
httplib::detail::MultipartFormDataParser::set_boundary
          (MultipartFormDataParser *this,string *boundary)

{
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __rhs = &this->boundary_;
  ::std::__cxx11::string::_M_assign((string *)__rhs);
  ::std::operator+(&local_60,&this->dash_,__rhs);
  ::std::operator+(&local_40,&local_60,&this->crlf_);
  ::std::__cxx11::string::operator=((string *)&this->dash_boundary_crlf_,(string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::operator+(&local_60,&this->crlf_,&this->dash_);
  ::std::operator+(&local_40,&local_60,__rhs);
  ::std::__cxx11::string::operator=((string *)&this->crlf_dash_boundary_,(string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void set_boundary(std::string &&boundary) {
    boundary_ = boundary;
    dash_boundary_crlf_ = dash_ + boundary_ + crlf_;
    crlf_dash_boundary_ = crlf_ + dash_ + boundary_;
  }